

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

void jsonnet_destroy(JsonnetVm *vm)

{
  JsonnetVm *in_RDI;
  
  if (in_RDI != (JsonnetVm *)0x0) {
    JsonnetVm::~JsonnetVm(in_RDI);
    operator_delete(in_RDI,0xf0);
  }
  return;
}

Assistant:

void jsonnet_destroy(JsonnetVm *vm)
{
    TRY
        delete vm;
    CATCH("jsonnet_destroy")
}